

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

int Abc_RecToGia3(Gia_Man_t *pMan,If_Man_t *pIfMan,If_Cut_t *pCut,Vec_Int_t *vLeaves,int fHash)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  Gia_Man_t *p;
  ulong *puVar5;
  Vec_Mem_t *pVVar6;
  undefined8 uVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  byte bVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Gia_Obj_t *pGVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  word *pwVar27;
  ulong *puVar28;
  Lms_Man_t *pLVar29;
  uint iLit0;
  word *tLimit;
  ulong uVar30;
  uint uCanonPhase;
  int BestPo;
  char pCanonPerm [16];
  uint local_7c;
  undefined8 local_78;
  Vec_Int_t *local_70;
  Lms_Man_t *local_68;
  int local_60;
  int local_5c;
  If_Cut_t *local_58;
  If_Man_t *local_50;
  char local_48 [24];
  
  pLVar29 = s_pMan3;
  p = s_pMan3->pGia;
  local_5c = -1;
  local_60 = fHash;
  if (pIfMan->pPars->fCutMin != 1) {
    __assert_fail("pIfMan->pPars->fCutMin == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                  ,0x45a,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)")
    ;
  }
  uVar2 = *(uint *)&pCut->field_0x1c;
  uVar24 = uVar2 >> 0x18;
  uVar20 = (ulong)uVar24;
  if (uVar24 != vLeaves->nSize) {
    __assert_fail("nLeaves == Vec_IntSize(vLeaves)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                  ,0x45b,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)")
    ;
  }
  local_68 = s_pMan3;
  uVar22 = pCut->iCutFunc;
  local_70 = vLeaves;
  if ((int)uVar22 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/if.h"
                  ,0x1ab,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  puVar5 = pIfMan->puTempW;
  pVVar6 = pIfMan->vTtMem[uVar20];
  if (pVVar6 == (Vec_Mem_t *)0x0) {
    pwVar27 = (word *)0x0;
  }
  else {
    uVar25 = uVar22 >> 1;
    if (pVVar6->nEntries <= (int)uVar25) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar27 = pVVar6->ppPages[uVar25 >> ((byte)pVVar6->LogPageSze & 0x1f)] +
              (ulong)(uVar25 & pVVar6->PageMask) * (long)pVVar6->nEntrySize;
  }
  uVar25 = pIfMan->nTruth6Words[uVar20];
  if ((uVar22 & 1) == 0) {
    if (0 < (int)uVar25) {
      uVar11 = 0;
      do {
        puVar5[uVar11] = pwVar27[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar25 != uVar11);
    }
  }
  else if (0 < (int)uVar25) {
    uVar11 = 0;
    do {
      puVar5[uVar11] = ~pwVar27[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar25 != uVar11);
  }
  if (uVar2 < 0x1000000) {
    return uVar22 & 1;
  }
  local_78 = (Gia_Obj_t *)(CONCAT44(local_78._4_4_,uVar22) & 0xffffffff00000001);
  iVar16 = uVar24 - 6;
  uVar22 = 1 << ((byte)iVar16 & 0x1f);
  uVar11 = (ulong)uVar22;
  if ((int)uVar22 < 2) {
    uVar11 = 1;
  }
  uVar23 = 0;
  uVar25 = 0;
LAB_00298a42:
  bVar10 = (byte)uVar23;
  if (uVar2 < 0x7000000) {
    if ((s_Truths6Neg[uVar23] & (*puVar5 >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) ^ *puVar5)) != 0)
    {
      uVar25 = uVar25 | 1 << ((uint)uVar23 & 0x1f);
    }
  }
  else if (uVar23 < 6) {
    if (iVar16 != 0x1f) {
      uVar17 = 1 << (bVar10 & 0x1f);
      uVar21 = 0;
      do {
        if (((puVar5[uVar21] >> ((byte)uVar17 & 0x3f) ^ puVar5[uVar21]) & s_Truths6Neg[uVar23]) != 0
           ) goto LAB_00298b2f;
        uVar21 = uVar21 + 1;
      } while (uVar11 != uVar21);
    }
  }
  else if (iVar16 != 0x1f) {
    bVar15 = (byte)(uVar23 - 6);
    uVar17 = 1 << (bVar15 & 0x1f);
    iVar26 = 2 << (bVar15 & 0x1f);
    uVar21 = 1;
    if (1 < (int)uVar17) {
      uVar21 = (ulong)uVar17;
    }
    puVar19 = puVar5 + (int)uVar17;
    puVar28 = puVar5;
    do {
      if (uVar23 - 6 != 0x1f) {
        uVar30 = 0;
        do {
          if (puVar28[uVar30] != puVar19[uVar30]) {
            uVar17 = 1 << (bVar10 & 0x1f);
            goto LAB_00298b2f;
          }
          uVar30 = uVar30 + 1;
        } while (uVar21 != uVar30);
      }
      puVar28 = puVar28 + iVar26;
      puVar19 = puVar19 + iVar26;
    } while (puVar28 < puVar5 + (int)uVar22);
  }
  goto LAB_00298b35;
LAB_00298b2f:
  uVar25 = uVar17 | uVar25;
LAB_00298b35:
  uVar23 = uVar23 + 1;
  if (uVar23 == uVar20) goto code_r0x00298b42;
  goto LAB_00298a42;
code_r0x00298b42:
  if (uVar25 == 0) {
    return (uint)local_78;
  }
  local_58 = pCut;
  local_50 = pIfMan;
  if ((int)uVar25 < 1) {
    __assert_fail("Supp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x3f9,"int Abc_TtSuppIsMinBase(int)");
  }
  if ((uVar25 == 1) || ((uVar25 + 1 & uVar25) != 0)) {
    if ((uVar25 & uVar25 - 1) != 0) {
      __assert_fail("Abc_TtSuppOnlyOne(uSupport)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                    ,0x463,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    lVar18 = 0;
    do {
      if ((uVar25 >> ((uint)lVar18 & 0x1f) & 1) != 0) {
        if ((uint)lVar18 < uVar24) {
          if (-1 < vLeaves->pArray[lVar18]) {
            return (uint)local_78 ^ vLeaves->pArray[lVar18];
          }
          goto LAB_00299384;
        }
        break;
      }
      lVar18 = lVar18 + 1;
    } while ((int)lVar18 != 0x20);
  }
  else {
    uVar22 = (uVar25 >> 1 & 0x15555555) + (uVar25 & 0x55555555);
    uVar22 = (uVar22 >> 2 & 0x13333333) + (uVar22 & 0x33333333);
    uVar22 = (uVar22 >> 4 & 0x7070707) + (uVar22 & 0x7070707);
    uVar22 = (uVar22 >> 8 & 0xf000f) + (uVar22 & 0xf000f);
    if ((uVar22 >> 0x10) + (uVar22 & 0xffff) != uVar24) {
      __assert_fail("Gia_WordCountOnes(uSupport) == nLeaves",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                    ,0x466,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    If_CutFindBestStruct(pIfMan,pCut,local_48,&local_7c,&local_5c);
    if ((long)local_5c < 0) {
      __assert_fail("BestPo >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                    ,0x46a,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    if (local_5c < p->vCos->nSize) {
      iVar16 = p->vCos->pArray[local_5c];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) {
LAB_002993a3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar14 = p->pObjs + iVar16;
      if (p->vTtNodes == (Vec_Int_t *)0x0) {
        pVVar12 = (Vec_Int_t *)malloc(0x10);
        pVVar12->nCap = 0x100;
        pVVar12->nSize = 0;
        piVar13 = (int *)malloc(0x400);
        pVVar12->pArray = piVar13;
        p->vTtNodes = pVVar12;
      }
      if (((int)(uint)*(undefined8 *)(pGVar14 + -(*(ulong *)pGVar14 & 0x1fffffff)) < 0) ||
         (((uint)*(undefined8 *)(pGVar14 + -(*(ulong *)pGVar14 & 0x1fffffff)) & 0x1fffffff) ==
          0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                      ,0x470,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      local_78 = pGVar14;
      Gia_ObjCollectInternal(p,pGVar14 + -(*(ulong *)pGVar14 & 0x1fffffff));
      uVar22 = local_7c;
      if (p->vTtNodes->nSize < 1) {
        __assert_fail("Vec_IntSize(pGia->vTtNodes) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                      ,0x472,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      pLVar29->vLabels->nSize = 0;
      uVar11 = 0;
      do {
        cVar1 = local_48[uVar11];
        if ((cVar1 < '\0') || (vLeaves->nSize <= (int)cVar1)) goto LAB_00299323;
        if (vLeaves->pArray[(uint)(int)cVar1] < 0) goto LAB_00299384;
        Vec_IntPush(pLVar29->vLabels,
                    (uint)((uVar22 >> ((uint)uVar11 & 0x1f) & 1) != 0) ^
                    vLeaves->pArray[(uint)(int)cVar1]);
        uVar11 = uVar11 + 1;
      } while (uVar20 != uVar11);
      pVVar12 = p->vTtNodes;
      lVar18 = 0;
      do {
        iVar16 = pVVar12->pArray[lVar18];
        if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_002993a3;
        pVVar12 = (Vec_Int_t *)(p->pObjs + iVar16);
        uVar20._0_4_ = pVVar12->nCap;
        uVar20._4_4_ = pVVar12->nSize;
        pVVar12->nCap = (int)(uVar20 & 0xffffffffbfffffff);
        pVVar12->nSize = (int)((uVar20 & 0xffffffffbfffffff) >> 0x20);
        uVar7 = *(undefined8 *)((long)pVVar12 + (ulong)((undefined4)uVar20 & 0x1fffffff) * -0xc);
        uVar22 = (uint)uVar7;
        pVVar8 = pLVar29->vLabels;
        if ((~uVar22 & 0x1fffffff) == 0 || (int)uVar22 < 0) {
          if (-1 < (int)uVar22) goto LAB_002993c2;
          uVar22 = (uint)((ulong)uVar7 >> 0x20);
          uVar25 = pVVar8->nSize;
          if ((int)uVar25 <= (int)(uVar22 & 0x1fffffff)) goto LAB_00299323;
          piVar13 = pVVar8->pArray;
          uVar22 = uVar22 & 0x1fffffff;
        }
        else {
          pGVar14 = (Gia_Obj_t *)((long)pVVar12 + (ulong)((undefined4)uVar20 & 0x1fffffff) * -0xc);
          pGVar9 = p->pObjs;
          if ((pGVar14 < pGVar9) || (pGVar9 + p->nObjs <= pGVar14)) goto LAB_00299365;
          uVar22 = (int)((long)pGVar14 - (long)pGVar9 >> 2) * -0x55555555;
          if (((int)uVar22 < 0) ||
             (((p->vTtNums->nSize <= (int)uVar22 ||
               (uVar22 = p->vTtNums->pArray[uVar22 & 0x7fffffff] + uVar24, (int)uVar22 < 0)) ||
              (uVar25 = pVVar8->nSize, (int)uVar25 <= (int)uVar22)))) goto LAB_00299323;
          piVar13 = pVVar8->pArray;
        }
        uVar22 = piVar13[uVar22];
        if ((int)uVar22 < 0) goto LAB_00299384;
        uVar7 = *(undefined8 *)((long)pVVar12 + (ulong)(uVar20._4_4_ & 0x1fffffff) * -0xc);
        uVar17 = (uint)uVar7;
        if ((~uVar17 & 0x1fffffff) == 0 || (int)uVar17 < 0) {
          if (-1 < (int)uVar17) {
LAB_002993c2:
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar17 = (uint)((ulong)uVar7 >> 0x20);
          if (uVar25 <= (uVar17 & 0x1fffffff)) goto LAB_00299323;
          uVar17 = uVar17 & 0x1fffffff;
        }
        else {
          pGVar14 = (Gia_Obj_t *)((long)pVVar12 + (ulong)(uVar20._4_4_ & 0x1fffffff) * -0xc);
          pGVar9 = p->pObjs;
          if ((pGVar14 < pGVar9) || (pGVar9 + p->nObjs <= pGVar14)) goto LAB_00299365;
          uVar17 = (int)((long)pGVar14 - (long)pGVar9 >> 2) * -0x55555555;
          if ((((int)uVar17 < 0) ||
              ((p->vTtNums->nSize <= (int)uVar17 ||
               (uVar17 = p->vTtNums->pArray[uVar17 & 0x7fffffff] + uVar24, (int)uVar17 < 0)))) ||
             (uVar25 <= uVar17)) goto LAB_00299323;
        }
        uVar25 = piVar13[uVar17];
        if ((int)uVar25 < 0) goto LAB_00299384;
        iLit0 = (uint)(uVar20 >> 0x1d) & 1 ^ uVar22;
        uVar17 = (uint)uVar20._4_4_ >> 0x1d & 1 ^ uVar25;
        local_70 = pVVar12;
        if (local_60 == 0) {
          pGVar14 = Gia_ManAppendObj(pMan);
          pLVar29 = local_68;
          uVar22 = uVar22 >> 1;
          uVar3 = pMan->nObjs;
          if ((int)uVar3 <= (int)uVar22) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x27a,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar25 = uVar25 >> 1;
          if (uVar3 <= uVar25) {
            __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x27b,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          if ((uVar22 == uVar25) && (pMan->fGiaSimple == 0)) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x27c,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          pGVar9 = pMan->pObjs;
          iVar16 = (int)pGVar14;
          if (iLit0 < uVar17) {
            if (pGVar9 + uVar3 <= pGVar14 || pGVar14 < pGVar9) goto LAB_00299365;
            uVar20 = *(ulong *)pGVar14;
            uVar11 = (ulong)((iLit0 & 1) << 0x1d |
                            ((uint)(iVar16 - (int)pGVar9) >> 2) * -0x55555555 - uVar22 & 0x1fffffff)
            ;
            *(ulong *)pGVar14 = uVar11 | uVar20 & 0xffffffffc0000000;
            pGVar9 = pMan->pObjs;
            if ((pGVar14 < pGVar9) || (pGVar9 + pMan->nObjs <= pGVar14)) goto LAB_00299365;
            uVar20 = (ulong)(uVar17 & 1) << 0x3d |
                     (ulong)(((uint)(iVar16 - (int)pGVar9) >> 2) * -0x55555555 - uVar25 & 0x1fffffff
                            ) << 0x20 | uVar11 | uVar20 & 0xc0000000c0000000;
          }
          else {
            if (pGVar9 + uVar3 <= pGVar14 || pGVar14 < pGVar9) goto LAB_00299365;
            uVar11 = (ulong)(((uint)(iVar16 - (int)pGVar9) >> 2) * -0x55555555 - uVar22 & 0x1fffffff
                            ) << 0x20;
            uVar20 = *(ulong *)pGVar14;
            uVar23 = (ulong)(iLit0 & 1) << 0x3d;
            *(ulong *)pGVar14 = uVar23 | uVar20 & 0xc0000000ffffffff | uVar11;
            pGVar9 = pMan->pObjs;
            if ((pGVar14 < pGVar9) || (pGVar9 + pMan->nObjs <= pGVar14)) goto LAB_00299365;
            uVar20 = (ulong)((uVar17 & 1) << 0x1d) | uVar23 | uVar20 & 0xc0000000c0000000 | uVar11 |
                     (ulong)(((uint)(iVar16 - (int)pGVar9) >> 2) * -0x55555555 - uVar25 & 0x1fffffff
                            );
          }
          *(ulong *)pGVar14 = uVar20;
          if (pMan->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(pMan,pGVar14 + -(uVar20 & 0x1fffffff),pGVar14);
            Gia_ObjAddFanout(pMan,pGVar14 + -((ulong)*(uint *)&pGVar14->field_0x4 & 0x1fffffff),
                             pGVar14);
          }
          if (pMan->fSweeper != 0) {
            uVar11 = *(ulong *)pGVar14 & 0x1fffffff;
            uVar20 = *(ulong *)pGVar14 >> 0x20 & 0x1fffffff;
            uVar23 = 0x4000000000000000;
            if (((uint)*(ulong *)(pGVar14 + -uVar11) >> 0x1e & 1) == 0) {
              uVar23 = 0x40000000;
            }
            *(ulong *)(pGVar14 + -uVar11) = uVar23 | *(ulong *)(pGVar14 + -uVar11);
            uVar23 = *(ulong *)(pGVar14 + -uVar20);
            uVar21 = 0x4000000000000000;
            if (((uint)uVar23 >> 0x1e & 1) == 0) {
              uVar21 = 0x40000000;
            }
            *(ulong *)(pGVar14 + -uVar20) = uVar21 | uVar23;
            uVar20 = *(ulong *)pGVar14;
            *(ulong *)pGVar14 =
                 uVar20 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar20 >> 0x3d) ^ (uint)(uVar23 >> 0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pGVar14 + -uVar11) >> 0x3f) ^
                        (uint)(uVar20 >> 0x1d) & 7)) << 0x3f;
          }
          pGVar9 = pMan->pObjs;
          if ((pGVar14 < pGVar9) || (pGVar9 + pMan->nObjs <= pGVar14)) goto LAB_00299365;
          iVar16 = (int)((ulong)((long)pGVar14 - (long)pGVar9) >> 2) * 0x55555556;
        }
        else {
          iVar16 = Gia_ManHashAnd(pMan,iLit0,uVar17);
          pLVar29 = local_68;
        }
        Vec_IntPush(pLVar29->vLabels,iVar16);
        lVar18 = lVar18 + 1;
        pVVar12 = p->vTtNodes;
      } while (lVar18 < pVVar12->nSize);
      uVar4 = local_70->nCap;
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pGiaTemp)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                      ,0x48e,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      pVVar12 = (Vec_Int_t *)p->pObjs;
      if ((local_70 < pVVar12) || ((Vec_Int_t *)(&pVVar12->nCap + (long)p->nObjs * 3) <= local_70))
      {
LAB_00299365:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar22 = (int)((long)local_70 - (long)pVVar12 >> 2) * -0x55555555;
      if ((((-1 < (int)uVar22) && ((int)uVar22 < p->vTtNums->nSize)) &&
          (uVar24 = p->vTtNums->pArray[uVar22 & 0x7fffffff] + uVar24, -1 < (int)uVar24)) &&
         ((int)uVar24 < pLVar29->vLabels->nSize)) {
        uVar24 = pLVar29->vLabels->pArray[uVar24];
        if (-1 < (int)uVar24) {
          return (local_7c >> ((byte)(uVar2 >> 0x18) & 0x1f) ^
                 *(uint *)local_78 >> 0x1d ^ *(uint *)&local_58->field_0x1c >> 0xc) & 1 ^ uVar24;
        }
LAB_00299384:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
    }
  }
LAB_00299323:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_RecToGia3( Gia_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, Vec_Int_t * vLeaves, int fHash )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    int iFan0, iFan1, iGiaObj;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pGiaPo, * pGiaTemp = NULL;
    int i, uSupport, BestPo = -1, nLeaves = If_CutLeaveNum(pCut);
    assert( pIfMan->pPars->fCutMin == 1 );
    assert( nLeaves == Vec_IntSize(vLeaves) );

    // compute support
    uSupport = Abc_TtSupport( If_CutTruthW(pIfMan, pCut), nLeaves );
    if ( uSupport == 0 )
        return Abc_LitNotCond( 0, If_CutTruthIsCompl(pCut) );
    if ( !Abc_TtSuppIsMinBase(uSupport) || uSupport == 1 )
    {
        assert( Abc_TtSuppOnlyOne(uSupport) );
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, Abc_TtSuppFindFirst(uSupport)), If_CutTruthIsCompl(pCut) );
    }
    assert( Gia_WordCountOnes(uSupport) == nLeaves );

    // get the best output for this node
    If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, &BestPo );
    assert( BestPo >= 0 );
    pGiaPo = Gia_ManCo( pGia, BestPo );

    // collect internal nodes into pGia->vTtNodes
    if ( pGia->vTtNodes == NULL )
        pGia->vTtNodes = Vec_IntAlloc( 256 );
    assert( Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) ) );
    Gia_ObjCollectInternal( pGia, Gia_ObjFanin0(pGiaPo) );
    assert( Vec_IntSize(pGia->vTtNodes) > 0 );

    // collect GIA nodes for leaves
    Vec_IntClear( p->vLabels );
    for (i = 0; i < nLeaves; i++)
        Vec_IntPush( p->vLabels, Abc_LitNotCond(Vec_IntEntry(vLeaves, pCanonPerm[i]), (uCanonPhase >> i) & 1) );

    // compute HOP nodes for internal nodes
    Gia_ManForEachObjVec( pGia->vTtNodes, pGia, pGiaTemp, i )
    {
        pGiaTemp->fMark0 = 0; // unmark node marked by Gia_ObjCollectInternal()
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pGiaTemp)) )
            iFan0 = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, Gia_ObjFanin0(pGiaTemp)) + nLeaves);
        else
            iFan0 = Vec_IntEntry(p->vLabels, Gia_ObjCioId(Gia_ObjFanin0(pGiaTemp)));
        iFan0 = Abc_LitNotCond(iFan0, Gia_ObjFaninC0(pGiaTemp));
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pGiaTemp)) )
            iFan1 = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, Gia_ObjFanin1(pGiaTemp)) + nLeaves);
        else
            iFan1 = Vec_IntEntry(p->vLabels, Gia_ObjCioId(Gia_ObjFanin1(pGiaTemp)));
        iFan1 = Abc_LitNotCond(iFan1, Gia_ObjFaninC1(pGiaTemp));
        if ( fHash )
            iGiaObj = Gia_ManHashAnd(pMan, iFan0, iFan1);
        else
            iGiaObj = Gia_ManAppendAnd(pMan, iFan0, iFan1);
        Vec_IntPush(p->vLabels, iGiaObj);
    }
    // get the final result
    assert( Gia_ObjIsAnd(pGiaTemp) );
    iGiaObj = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, pGiaTemp) + nLeaves);
    // complement the result if needed
    return Abc_LitNotCond( iGiaObj,  Gia_ObjFaninC0(pGiaPo) ^ ((uCanonPhase >> nLeaves) & 1) ^ pCut->fCompl );    
}